

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_getItemBySpecificTypeDuplicateId_Test::TestBody
          (Annotator_getItemBySpecificTypeDuplicateId_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  char *pcVar2;
  element_type *peVar3;
  AssertHelper local_17a0 [8];
  Message local_1798 [8];
  shared_ptr<libcellml::Issue> local_1790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1780;
  undefined1 local_1760 [8];
  AssertionResult gtest_ar_80;
  Message local_1748 [8];
  unsigned_long local_1740 [2];
  undefined1 local_1730 [8];
  AssertionResult gtest_ar_79;
  Message local_1718 [15];
  allocator<char> local_1709;
  string local_1708 [32];
  shared_ptr<libcellml::ImportSource> local_16e8;
  undefined1 local_16d8 [16];
  AssertionResult gtest_ar_78;
  Message local_16b8 [8];
  shared_ptr<libcellml::Issue> local_16b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16a0;
  undefined1 local_1680 [8];
  AssertionResult gtest_ar_77;
  Message local_1668 [8];
  unsigned_long local_1660 [2];
  undefined1 local_1650 [8];
  AssertionResult gtest_ar_76;
  Message local_1638 [15];
  allocator<char> local_1629;
  string local_1628 [32];
  shared_ptr<libcellml::VariablePair> local_1608;
  undefined1 local_15f8 [16];
  AssertionResult gtest_ar_75;
  Message local_15d8 [8];
  shared_ptr<libcellml::Issue> local_15d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15c0;
  undefined1 local_15a0 [8];
  AssertionResult gtest_ar_74;
  Message local_1588 [8];
  unsigned_long local_1580 [2];
  undefined1 local_1570 [8];
  AssertionResult gtest_ar_73;
  Message local_1558 [15];
  allocator<char> local_1549;
  string local_1548 [32];
  shared_ptr<libcellml::VariablePair> local_1528;
  undefined1 local_1518 [16];
  AssertionResult gtest_ar_72;
  Message local_14f8 [8];
  shared_ptr<libcellml::Issue> local_14f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14e0;
  undefined1 local_14c0 [8];
  AssertionResult gtest_ar_71;
  Message local_14a8 [8];
  unsigned_long local_14a0 [2];
  undefined1 local_1490 [8];
  AssertionResult gtest_ar_70;
  Message local_1478 [15];
  allocator<char> local_1469;
  string local_1468 [32];
  shared_ptr<libcellml::Component> local_1448;
  undefined1 local_1438 [16];
  AssertionResult gtest_ar_69;
  Message local_1418 [8];
  shared_ptr<libcellml::Issue> local_1410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1400;
  undefined1 local_13e0 [8];
  AssertionResult gtest_ar_68;
  Message local_13c8 [8];
  unsigned_long local_13c0 [2];
  undefined1 local_13b0 [8];
  AssertionResult gtest_ar_67;
  Message local_1398 [15];
  allocator<char> local_1389;
  string local_1388 [32];
  shared_ptr<libcellml::Reset> local_1368;
  undefined1 local_1358 [16];
  AssertionResult gtest_ar_66;
  Message local_1338 [8];
  shared_ptr<libcellml::Issue> local_1330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1320;
  undefined1 local_1300 [8];
  AssertionResult gtest_ar_65;
  Message local_12e8 [8];
  unsigned_long local_12e0 [2];
  undefined1 local_12d0 [8];
  AssertionResult gtest_ar_64;
  Message local_12b8 [15];
  allocator<char> local_12a9;
  string local_12a8 [32];
  shared_ptr<libcellml::Reset> local_1288;
  undefined1 local_1278 [16];
  AssertionResult gtest_ar_63;
  Message local_1258 [8];
  shared_ptr<libcellml::Issue> local_1250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1240;
  undefined1 local_1220 [8];
  AssertionResult gtest_ar_62;
  Message local_1208 [8];
  unsigned_long local_1200 [2];
  undefined1 local_11f0 [8];
  AssertionResult gtest_ar_61;
  Message local_11d8 [15];
  allocator<char> local_11c9;
  string local_11c8 [32];
  shared_ptr<libcellml::Reset> local_11a8;
  undefined1 local_1198 [16];
  AssertionResult gtest_ar_60;
  Message local_1178 [8];
  shared_ptr<libcellml::Issue> local_1170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1160;
  undefined1 local_1140 [8];
  AssertionResult gtest_ar_59;
  Message local_1128 [8];
  unsigned_long local_1120 [2];
  undefined1 local_1110 [8];
  AssertionResult gtest_ar_58;
  Message local_10f8 [15];
  allocator<char> local_10e9;
  string local_10e8 [32];
  shared_ptr<libcellml::UnitsItem> local_10c8;
  undefined1 local_10b8 [16];
  AssertionResult gtest_ar_57;
  Message local_1098 [8];
  shared_ptr<libcellml::Issue> local_1090;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1080;
  undefined1 local_1060 [8];
  AssertionResult gtest_ar_56;
  Message local_1048 [8];
  unsigned_long local_1040 [2];
  undefined1 local_1030 [8];
  AssertionResult gtest_ar_55;
  Message local_1018 [15];
  allocator<char> local_1009;
  string local_1008 [32];
  shared_ptr<libcellml::Units> local_fe8;
  undefined1 local_fd8 [16];
  AssertionResult gtest_ar_54;
  Message local_fb8 [8];
  shared_ptr<libcellml::Issue> local_fb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fa0;
  undefined1 local_f80 [8];
  AssertionResult gtest_ar_53;
  Message local_f68 [8];
  unsigned_long local_f60 [2];
  undefined1 local_f50 [8];
  AssertionResult gtest_ar_52;
  Message local_f38 [15];
  allocator<char> local_f29;
  string local_f28 [32];
  shared_ptr<libcellml::Variable> local_f08;
  undefined1 local_ef8 [16];
  AssertionResult gtest_ar_51;
  Message local_ed8 [8];
  shared_ptr<libcellml::Issue> local_ed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ec0;
  undefined1 local_ea0 [8];
  AssertionResult gtest_ar_50;
  Message local_e88 [8];
  unsigned_long local_e80 [2];
  undefined1 local_e70 [8];
  AssertionResult gtest_ar_49;
  Message local_e58 [15];
  allocator<char> local_e49;
  string local_e48 [32];
  shared_ptr<libcellml::Component> local_e28;
  undefined1 local_e18 [16];
  AssertionResult gtest_ar_48;
  Message local_df8 [8];
  shared_ptr<libcellml::Issue> local_df0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_de0;
  undefined1 local_dc0 [8];
  AssertionResult gtest_ar_47;
  Message local_da8 [8];
  unsigned_long local_da0 [2];
  undefined1 local_d90 [8];
  AssertionResult gtest_ar_46;
  Message local_d78 [15];
  allocator<char> local_d69;
  string local_d68 [32];
  shared_ptr<libcellml::Model> local_d48;
  undefined1 local_d38 [16];
  AssertionResult gtest_ar_45;
  Message local_d18 [8];
  shared_ptr<libcellml::Issue> local_d10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d00;
  undefined1 local_ce0 [8];
  AssertionResult gtest_ar_44;
  Message local_cc8 [8];
  unsigned_long local_cc0 [2];
  undefined1 local_cb0 [8];
  AssertionResult gtest_ar_43;
  Message local_c98 [15];
  allocator<char> local_c89;
  string local_c88 [32];
  shared_ptr<libcellml::Model> local_c68;
  undefined1 local_c58 [16];
  AssertionResult gtest_ar_42;
  Message local_c38 [8];
  unsigned_long local_c30 [2];
  undefined1 local_c20 [8];
  AssertionResult gtest_ar_41;
  Message local_c08 [8];
  unsigned_long local_c00 [2];
  undefined1 local_bf0 [8];
  AssertionResult gtest_ar_40;
  Message local_bd8 [8];
  unsigned_long local_bd0 [2];
  undefined1 local_bc0 [8];
  AssertionResult gtest_ar_39;
  Message local_ba8 [8];
  shared_ptr<libcellml::Issue> local_ba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b90;
  undefined1 local_b70 [8];
  AssertionResult gtest_ar_38;
  Message local_b58 [8];
  unsigned_long local_b50 [2];
  undefined1 local_b40 [8];
  AssertionResult gtest_ar_37;
  Message local_b28 [15];
  allocator<char> local_b19;
  string local_b18 [32];
  shared_ptr<libcellml::ImportSource> local_af8;
  undefined1 local_ae8 [16];
  AssertionResult gtest_ar_36;
  Message local_ac8 [8];
  shared_ptr<libcellml::Issue> local_ac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab0;
  undefined1 local_a90 [8];
  AssertionResult gtest_ar_35;
  Message local_a78 [8];
  unsigned_long local_a70 [2];
  undefined1 local_a60 [8];
  AssertionResult gtest_ar_34;
  Message local_a48 [15];
  allocator<char> local_a39;
  string local_a38 [32];
  shared_ptr<libcellml::VariablePair> local_a18;
  undefined1 local_a08 [16];
  AssertionResult gtest_ar_33;
  Message local_9e8 [8];
  shared_ptr<libcellml::Issue> local_9e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  undefined1 local_9b0 [8];
  AssertionResult gtest_ar_32;
  Message local_998 [8];
  unsigned_long local_990 [2];
  undefined1 local_980 [8];
  AssertionResult gtest_ar_31;
  Message local_968 [15];
  allocator<char> local_959;
  string local_958 [32];
  shared_ptr<libcellml::VariablePair> local_938;
  undefined1 local_928 [16];
  AssertionResult gtest_ar_30;
  Message local_908 [8];
  shared_ptr<libcellml::Issue> local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  undefined1 local_8d0 [8];
  AssertionResult gtest_ar_29;
  Message local_8b8 [8];
  unsigned_long local_8b0 [2];
  undefined1 local_8a0 [8];
  AssertionResult gtest_ar_28;
  Message local_888 [15];
  allocator<char> local_879;
  string local_878 [32];
  shared_ptr<libcellml::Component> local_858;
  undefined1 local_848 [16];
  AssertionResult gtest_ar_27;
  Message local_828 [8];
  shared_ptr<libcellml::Issue> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  undefined1 local_7f0 [8];
  AssertionResult gtest_ar_26;
  Message local_7d8 [8];
  unsigned_long local_7d0 [2];
  undefined1 local_7c0 [8];
  AssertionResult gtest_ar_25;
  Message local_7a8 [15];
  allocator<char> local_799;
  string local_798 [32];
  shared_ptr<libcellml::Reset> local_778;
  undefined1 local_768 [16];
  AssertionResult gtest_ar_24;
  Message local_748 [8];
  shared_ptr<libcellml::Issue> local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  undefined1 local_710 [8];
  AssertionResult gtest_ar_23;
  Message local_6f8 [8];
  unsigned_long local_6f0 [2];
  undefined1 local_6e0 [8];
  AssertionResult gtest_ar_22;
  Message local_6c8 [15];
  allocator<char> local_6b9;
  string local_6b8 [32];
  shared_ptr<libcellml::Reset> local_698;
  undefined1 local_688 [16];
  AssertionResult gtest_ar_21;
  Message local_668 [8];
  shared_ptr<libcellml::Issue> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  undefined1 local_630 [8];
  AssertionResult gtest_ar_20;
  Message local_618 [8];
  unsigned_long local_610 [2];
  undefined1 local_600 [8];
  AssertionResult gtest_ar_19;
  Message local_5e8 [15];
  allocator<char> local_5d9;
  string local_5d8 [32];
  shared_ptr<libcellml::Reset> local_5b8;
  undefined1 local_5a8 [16];
  AssertionResult gtest_ar_18;
  Message local_588 [8];
  shared_ptr<libcellml::Issue> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  undefined1 local_550 [8];
  AssertionResult gtest_ar_17;
  Message local_538 [8];
  unsigned_long local_530 [2];
  undefined1 local_520 [8];
  AssertionResult gtest_ar_16;
  Message local_508 [15];
  allocator<char> local_4f9;
  string local_4f8 [32];
  shared_ptr<libcellml::UnitsItem> local_4d8;
  undefined1 local_4c8 [16];
  AssertionResult gtest_ar_15;
  Message local_4a8 [8];
  shared_ptr<libcellml::Issue> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  undefined1 local_470 [8];
  AssertionResult gtest_ar_14;
  Message local_458 [8];
  unsigned_long local_450 [2];
  undefined1 local_440 [8];
  AssertionResult gtest_ar_13;
  Message local_428 [15];
  allocator<char> local_419;
  string local_418 [32];
  shared_ptr<libcellml::Units> local_3f8;
  undefined1 local_3e8 [16];
  AssertionResult gtest_ar_12;
  Message local_3c8 [8];
  shared_ptr<libcellml::Issue> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_11;
  Message local_378 [8];
  unsigned_long local_370 [2];
  undefined1 local_360 [8];
  AssertionResult gtest_ar_10;
  Message local_348 [15];
  allocator<char> local_339;
  string local_338 [32];
  shared_ptr<libcellml::Variable> local_318;
  undefined1 local_308 [16];
  AssertionResult gtest_ar_9;
  Message local_2e8 [8];
  shared_ptr<libcellml::Issue> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_8;
  Message local_298 [8];
  unsigned_long local_290 [2];
  undefined1 local_280 [8];
  AssertionResult gtest_ar_7;
  Message local_268 [15];
  allocator<char> local_259;
  string local_258 [32];
  shared_ptr<libcellml::Component> local_238;
  undefined1 local_228 [16];
  AssertionResult gtest_ar_6;
  Message local_208 [8];
  shared_ptr<libcellml::Issue> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_5;
  Message local_1b8 [8];
  unsigned_long local_1b0 [2];
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_4;
  Message local_188 [15];
  allocator<char> local_179;
  string local_178 [32];
  shared_ptr<libcellml::Model> local_158;
  undefined1 local_148 [16];
  AssertionResult gtest_ar_3;
  Message local_128 [8];
  shared_ptr<libcellml::Issue> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_2;
  Message local_d8 [8];
  unsigned_long local_d0 [2];
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  Message local_a8 [15];
  allocator<char> local_99;
  string local_98 [32];
  shared_ptr<libcellml::Model> local_78;
  undefined1 local_68 [16];
  AssertionResult gtest_ar;
  undefined1 local_40 [8];
  ModelPtr model;
  AnnotatorPtr annotator;
  ParserPtr parser;
  Annotator_getItemBySpecificTypeDuplicateId_Test *this_local;
  
  this_00 = &annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  libcellml::Annotator::create();
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  libcellml::Parser::parseModel((string *)local_40);
  local_68._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,"duplicateId",&local_99);
  libcellml::Annotator::model((string *)&local_78);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Model>>
            (local_68 + 8,"nullptr",(void **)"annotator->model(\"duplicateId\")",
             (shared_ptr<libcellml::Model> *)local_68,&local_78);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_78);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_68 + 8));
  if (!bVar1) {
    testing::Message::Message(local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_68 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x11b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_68 + 8));
  local_d0[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_d0[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_c0,"size_t(1)","annotator->errorCount()",local_d0 + 1,local_d0
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x11c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::error((ulong)&local_120);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_120);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[58],std::__cxx11::string>
            ((EqHelper<false> *)local_f0,
             "\"This Annotator object does not have a model to work with.\"",
             "annotator->error(0)->description()",
             (char (*) [58])"This Annotator object does not have a model to work with.",&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x11d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_148._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_178,"duplicateId",&local_179);
  libcellml::Annotator::encapsulation((string *)&local_158);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Model>>
            (local_148 + 8,"nullptr",(void **)"annotator->encapsulation(\"duplicateId\")",
             (shared_ptr<libcellml::Model> *)local_148,&local_158);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_158);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_179);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_148 + 8));
  if (!bVar1) {
    testing::Message::Message(local_188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_148 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x11f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_148 + 8));
  local_1b0[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_1b0[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1a0,"size_t(1)","annotator->errorCount()",local_1b0 + 1,
             local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x120,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::error((ulong)&local_200);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_200);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[58],std::__cxx11::string>
            ((EqHelper<false> *)local_1d0,
             "\"This Annotator object does not have a model to work with.\"",
             "annotator->error(0)->description()",
             (char (*) [58])"This Annotator object does not have a model to work with.",&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(local_208);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x121,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  local_228._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_258,"duplicateId",&local_259);
  libcellml::Annotator::component((string *)&local_238);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::Component>>
            (local_228 + 8,"nullptr",(void **)"annotator->component(\"duplicateId\")",
             (shared_ptr<libcellml::Component> *)local_228,&local_238);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_238);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator(&local_259);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_228 + 8));
  if (!bVar1) {
    testing::Message::Message(local_268);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_228 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x123,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_228 + 8));
  local_290[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_290[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_280,"size_t(1)","annotator->errorCount()",local_290 + 1,
             local_290);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(local_298);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x124,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::error((ulong)&local_2e0);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_2e0);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[58],std::__cxx11::string>
            ((EqHelper<false> *)local_2b0,
             "\"This Annotator object does not have a model to work with.\"",
             "annotator->error(0)->description()",
             (char (*) [58])"This Annotator object does not have a model to work with.",&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_2e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(local_2e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x125,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  local_308._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_338,"duplicateId",&local_339);
  libcellml::Annotator::variable((string *)&local_318);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Variable>>
            (local_308 + 8,"nullptr",(void **)"annotator->variable(\"duplicateId\")",
             (shared_ptr<libcellml::Variable> *)local_308,&local_318);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_318);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator(&local_339);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_308 + 8));
  if (!bVar1) {
    testing::Message::Message(local_348);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_308 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x127,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_308 + 8));
  local_370[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_370[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_360,"size_t(1)","annotator->errorCount()",local_370 + 1,
             local_370);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(local_378);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x128,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::error((ulong)&local_3c0);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_3c0);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[58],std::__cxx11::string>
            ((EqHelper<false> *)local_390,
             "\"This Annotator object does not have a model to work with.\"",
             "annotator->error(0)->description()",
             (char (*) [58])"This Annotator object does not have a model to work with.",&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_3c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(local_3c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x129,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(local_3c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  local_3e8._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_418,"duplicateId",&local_419);
  libcellml::Annotator::units((string *)&local_3f8);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Units>>
            (local_3e8 + 8,"nullptr",(void **)"annotator->units(\"duplicateId\")",
             (shared_ptr<libcellml::Units> *)local_3e8,&local_3f8);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_3f8);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator(&local_419);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_3e8 + 8));
  if (!bVar1) {
    testing::Message::Message(local_428);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_3e8 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,299,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,local_428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_3e8 + 8));
  local_450[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_450[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_440,"size_t(1)","annotator->errorCount()",local_450 + 1,
             local_450);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    testing::Message::Message(local_458);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_440);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,300,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,local_458);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(local_458);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::error((ulong)&local_4a0);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_4a0);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[58],std::__cxx11::string>
            ((EqHelper<false> *)local_470,
             "\"This Annotator object does not have a model to work with.\"",
             "annotator->error(0)->description()",
             (char (*) [58])"This Annotator object does not have a model to work with.",&local_490);
  std::__cxx11::string::~string((string *)&local_490);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_4a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
  if (!bVar1) {
    testing::Message::Message(local_4a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_470);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x12d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,local_4a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(local_4a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
  local_4c8._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4f8,"duplicateId",&local_4f9);
  libcellml::Annotator::unitsItem((string *)&local_4d8);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::UnitsItem>>
            (local_4c8 + 8,"nullptr",(void **)"annotator->unitsItem(\"duplicateId\")",
             (shared_ptr<libcellml::UnitsItem> *)local_4c8,&local_4d8);
  std::shared_ptr<libcellml::UnitsItem>::~shared_ptr(&local_4d8);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator(&local_4f9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_4c8 + 8));
  if (!bVar1) {
    testing::Message::Message(local_508);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_4c8 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x12f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(local_508);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_4c8 + 8));
  local_530[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_530[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_520,"size_t(1)","annotator->errorCount()",local_530 + 1,
             local_530);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
  if (!bVar1) {
    testing::Message::Message(local_538);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_520);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x130,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,local_538);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(local_538);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::error((ulong)&local_580);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_580);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[58],std::__cxx11::string>
            ((EqHelper<false> *)local_550,
             "\"This Annotator object does not have a model to work with.\"",
             "annotator->error(0)->description()",
             (char (*) [58])"This Annotator object does not have a model to work with.",&local_570);
  std::__cxx11::string::~string((string *)&local_570);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_580);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
  if (!bVar1) {
    testing::Message::Message(local_588);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_550);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x131,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,local_588);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(local_588);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
  local_5a8._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5d8,"duplicateId",&local_5d9);
  libcellml::Annotator::reset((string *)&local_5b8);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Reset>>
            (local_5a8 + 8,"nullptr",(void **)"annotator->reset(\"duplicateId\")",
             (shared_ptr<libcellml::Reset> *)local_5a8,&local_5b8);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_5b8);
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator(&local_5d9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_5a8 + 8));
  if (!bVar1) {
    testing::Message::Message(local_5e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_5a8 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x133,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,local_5e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(local_5e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_5a8 + 8));
  local_610[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_610[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_600,"size_t(1)","annotator->errorCount()",local_610 + 1,
             local_610);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_600);
  if (!bVar1) {
    testing::Message::Message(local_618);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_600);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x134,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,local_618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(local_618);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_600);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::error((ulong)&local_660);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_660);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[58],std::__cxx11::string>
            ((EqHelper<false> *)local_630,
             "\"This Annotator object does not have a model to work with.\"",
             "annotator->error(0)->description()",
             (char (*) [58])"This Annotator object does not have a model to work with.",&local_650);
  std::__cxx11::string::~string((string *)&local_650);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_660);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_630);
  if (!bVar1) {
    testing::Message::Message(local_668);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_630);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x135,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,local_668);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(local_668);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_630);
  local_688._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6b8,"duplicateId",&local_6b9);
  libcellml::Annotator::resetValue((string *)&local_698);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Reset>>
            (local_688 + 8,"nullptr",(void **)"annotator->resetValue(\"duplicateId\")",
             (shared_ptr<libcellml::Reset> *)local_688,&local_698);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_698);
  std::__cxx11::string::~string(local_6b8);
  std::allocator<char>::~allocator(&local_6b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_688 + 8));
  if (!bVar1) {
    testing::Message::Message(local_6c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_688 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x137,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,local_6c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(local_6c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_688 + 8));
  local_6f0[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_6f0[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_6e0,"size_t(1)","annotator->errorCount()",local_6f0 + 1,
             local_6f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e0);
  if (!bVar1) {
    testing::Message::Message(local_6f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x138,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,local_6f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(local_6f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e0);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::error((ulong)&local_740);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_740);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[58],std::__cxx11::string>
            ((EqHelper<false> *)local_710,
             "\"This Annotator object does not have a model to work with.\"",
             "annotator->error(0)->description()",
             (char (*) [58])"This Annotator object does not have a model to work with.",&local_730);
  std::__cxx11::string::~string((string *)&local_730);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_740);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_710);
  if (!bVar1) {
    testing::Message::Message(local_748);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_710);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x139,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,local_748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(local_748);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_710);
  local_768._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_798,"duplicateId",&local_799);
  libcellml::Annotator::testValue((string *)&local_778);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Reset>>
            (local_768 + 8,"nullptr",(void **)"annotator->testValue(\"duplicateId\")",
             (shared_ptr<libcellml::Reset> *)local_768,&local_778);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_778);
  std::__cxx11::string::~string(local_798);
  std::allocator<char>::~allocator(&local_799);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_768 + 8));
  if (!bVar1) {
    testing::Message::Message(local_7a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_768 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x13b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,local_7a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(local_7a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_768 + 8));
  local_7d0[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_7d0[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_7c0,"size_t(1)","annotator->errorCount()",local_7d0 + 1,
             local_7d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c0);
  if (!bVar1) {
    testing::Message::Message(local_7d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x13c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(local_7d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c0);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::error((ulong)&local_820);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_820);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[58],std::__cxx11::string>
            ((EqHelper<false> *)local_7f0,
             "\"This Annotator object does not have a model to work with.\"",
             "annotator->error(0)->description()",
             (char (*) [58])"This Annotator object does not have a model to work with.",&local_810);
  std::__cxx11::string::~string((string *)&local_810);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_820);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f0);
  if (!bVar1) {
    testing::Message::Message(local_828);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x13d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,local_828);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(local_828);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f0);
  local_848._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_878,"duplicateId",&local_879);
  libcellml::Annotator::componentEncapsulation((string *)&local_858);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::Component>>
            (local_848 + 8,"nullptr",(void **)"annotator->componentEncapsulation(\"duplicateId\")",
             (shared_ptr<libcellml::Component> *)local_848,&local_858);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_858);
  std::__cxx11::string::~string(local_878);
  std::allocator<char>::~allocator(&local_879);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_848 + 8));
  if (!bVar1) {
    testing::Message::Message(local_888);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_848 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x13f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,local_888);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(local_888);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_848 + 8));
  local_8b0[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_8b0[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_8a0,"size_t(1)","annotator->errorCount()",local_8b0 + 1,
             local_8b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a0);
  if (!bVar1) {
    testing::Message::Message(local_8b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x140,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,local_8b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(local_8b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a0);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::error((ulong)&local_900);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_900);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[58],std::__cxx11::string>
            ((EqHelper<false> *)local_8d0,
             "\"This Annotator object does not have a model to work with.\"",
             "annotator->error(0)->description()",
             (char (*) [58])"This Annotator object does not have a model to work with.",&local_8f0);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_900);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d0);
  if (!bVar1) {
    testing::Message::Message(local_908);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x141,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,local_908);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(local_908);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d0);
  local_928._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_958,"duplicateId",&local_959);
  libcellml::Annotator::connection((string *)&local_938);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::VariablePair>>
            (local_928 + 8,"nullptr",(void **)"annotator->connection(\"duplicateId\")",
             (shared_ptr<libcellml::VariablePair> *)local_928,&local_938);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr(&local_938);
  std::__cxx11::string::~string(local_958);
  std::allocator<char>::~allocator(&local_959);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_928 + 8));
  if (!bVar1) {
    testing::Message::Message(local_968);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_928 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x143,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,local_968);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(local_968);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_928 + 8));
  local_990[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_990[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_980,"size_t(1)","annotator->errorCount()",local_990 + 1,
             local_990);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_980);
  if (!bVar1) {
    testing::Message::Message(local_998);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_980);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x144,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,local_998);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(local_998);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_980);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::error((ulong)&local_9e0);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_9e0);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[58],std::__cxx11::string>
            ((EqHelper<false> *)local_9b0,
             "\"This Annotator object does not have a model to work with.\"",
             "annotator->error(0)->description()",
             (char (*) [58])"This Annotator object does not have a model to work with.",&local_9d0);
  std::__cxx11::string::~string((string *)&local_9d0);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_9e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9b0);
  if (!bVar1) {
    testing::Message::Message(local_9e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x145,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_33.message_,local_9e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_33.message_);
    testing::Message::~Message(local_9e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9b0);
  local_a08._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a38,"duplicateId",&local_a39);
  libcellml::Annotator::mapVariables((string *)&local_a18);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::VariablePair>>
            (local_a08 + 8,"nullptr",(void **)"annotator->mapVariables(\"duplicateId\")",
             (shared_ptr<libcellml::VariablePair> *)local_a08,&local_a18);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr(&local_a18);
  std::__cxx11::string::~string(local_a38);
  std::allocator<char>::~allocator(&local_a39);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_a08 + 8));
  if (!bVar1) {
    testing::Message::Message(local_a48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_a08 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x147,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,local_a48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
    testing::Message::~Message(local_a48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_a08 + 8));
  local_a70[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_a70[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_a60,"size_t(1)","annotator->errorCount()",local_a70 + 1,
             local_a70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a60);
  if (!bVar1) {
    testing::Message::Message(local_a78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x148,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,local_a78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(local_a78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a60);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::error((ulong)&local_ac0);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_ac0);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[58],std::__cxx11::string>
            ((EqHelper<false> *)local_a90,
             "\"This Annotator object does not have a model to work with.\"",
             "annotator->error(0)->description()",
             (char (*) [58])"This Annotator object does not have a model to work with.",&local_ab0);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_ac0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a90);
  if (!bVar1) {
    testing::Message::Message(local_ac8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_36.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x149,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_36.message_,local_ac8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_36.message_);
    testing::Message::~Message(local_ac8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a90);
  local_ae8._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b18,"duplicateId",&local_b19);
  libcellml::Annotator::importSource((string *)&local_af8);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::ImportSource>>
            (local_ae8 + 8,"nullptr",(void **)"annotator->importSource(\"duplicateId\")",
             (shared_ptr<libcellml::ImportSource> *)local_ae8,&local_af8);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr(&local_af8);
  std::__cxx11::string::~string(local_b18);
  std::allocator<char>::~allocator(&local_b19);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_ae8 + 8));
  if (!bVar1) {
    testing::Message::Message(local_b28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_ae8 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x14b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_37.message_,local_b28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37.message_);
    testing::Message::~Message(local_b28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_ae8 + 8));
  local_b50[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_b50[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_b40,"size_t(1)","annotator->errorCount()",local_b50 + 1,
             local_b50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b40);
  if (!bVar1) {
    testing::Message::Message(local_b58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_38.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x14c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_38.message_,local_b58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_38.message_);
    testing::Message::~Message(local_b58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b40);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::error((ulong)&local_ba0);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_ba0);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[58],std::__cxx11::string>
            ((EqHelper<false> *)local_b70,
             "\"This Annotator object does not have a model to work with.\"",
             "annotator->error(0)->description()",
             (char (*) [58])"This Annotator object does not have a model to work with.",&local_b90);
  std::__cxx11::string::~string((string *)&local_b90);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_ba0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b70);
  if (!bVar1) {
    testing::Message::Message(local_ba8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_39.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x14d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_39.message_,local_ba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_39.message_);
    testing::Message::~Message(local_ba8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b70);
  peVar3 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::setModel((shared_ptr *)peVar3);
  local_bd0[1] = 0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_bd0[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_bc0,"size_t(0)","annotator->errorCount()",local_bd0 + 1,
             local_bd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc0);
  if (!bVar1) {
    testing::Message::Message(local_bd8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_40.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x152,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_40.message_,local_bd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_40.message_);
    testing::Message::~Message(local_bd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bc0);
  local_c00[1] = 0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_c00[0] = libcellml::Logger::warningCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_bf0,"size_t(0)","annotator->warningCount()",local_c00 + 1,
             local_c00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bf0);
  if (!bVar1) {
    testing::Message::Message(local_c08);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bf0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_41.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x153,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_41.message_,local_c08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_41.message_);
    testing::Message::~Message(local_c08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bf0);
  local_c30[1] = 0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_c30[0] = libcellml::Logger::messageCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_c20,"size_t(0)","annotator->messageCount()",local_c30 + 1,
             local_c30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c20);
  if (!bVar1) {
    testing::Message::Message(local_c38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_42.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x154,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_42.message_,local_c38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_42.message_);
    testing::Message::~Message(local_c38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c20);
  local_c58._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c88,"duplicateId",&local_c89);
  libcellml::Annotator::model((string *)&local_c68);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Model>>
            (local_c58 + 8,"nullptr",(void **)"annotator->model(\"duplicateId\")",
             (shared_ptr<libcellml::Model> *)local_c58,&local_c68);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_c68);
  std::__cxx11::string::~string(local_c88);
  std::allocator<char>::~allocator(&local_c89);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_c58 + 8));
  if (!bVar1) {
    testing::Message::Message(local_c98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_c58 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_43.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x157,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_43.message_,local_c98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_43.message_);
    testing::Message::~Message(local_c98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_c58 + 8));
  local_cc0[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_cc0[0] = libcellml::Logger::warningCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_cb0,"size_t(1)","annotator->warningCount()",local_cc0 + 1,
             local_cc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cb0);
  if (!bVar1) {
    testing::Message::Message(local_cc8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_cb0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_44.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x158,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_44.message_,local_cc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_44.message_);
    testing::Message::~Message(local_cc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cb0);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::warning((ulong)&local_d10);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_d10);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[94],std::__cxx11::string>
            ((EqHelper<false> *)local_ce0,
             "\"The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located.\""
             ,"annotator->warning(0)->description()",
             (char (*) [94])
             "The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located."
             ,&local_d00);
  std::__cxx11::string::~string((string *)&local_d00);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_d10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ce0);
  if (!bVar1) {
    testing::Message::Message(local_d18);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ce0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_45.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x159,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_45.message_,local_d18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_45.message_);
    testing::Message::~Message(local_d18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ce0);
  local_d38._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d68,"duplicateId",&local_d69);
  libcellml::Annotator::encapsulation((string *)&local_d48);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Model>>
            (local_d38 + 8,"nullptr",(void **)"annotator->encapsulation(\"duplicateId\")",
             (shared_ptr<libcellml::Model> *)local_d38,&local_d48);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_d48);
  std::__cxx11::string::~string(local_d68);
  std::allocator<char>::~allocator(&local_d69);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_d38 + 8));
  if (!bVar1) {
    testing::Message::Message(local_d78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_d38 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_46.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x15b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_46.message_,local_d78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_46.message_);
    testing::Message::~Message(local_d78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_d38 + 8));
  local_da0[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_da0[0] = libcellml::Logger::warningCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_d90,"size_t(1)","annotator->warningCount()",local_da0 + 1,
             local_da0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d90);
  if (!bVar1) {
    testing::Message::Message(local_da8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_47.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x15c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_47.message_,local_da8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_47.message_);
    testing::Message::~Message(local_da8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d90);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::warning((ulong)&local_df0);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_df0);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[94],std::__cxx11::string>
            ((EqHelper<false> *)local_dc0,
             "\"The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located.\""
             ,"annotator->warning(0)->description()",
             (char (*) [94])
             "The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located."
             ,&local_de0);
  std::__cxx11::string::~string((string *)&local_de0);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_df0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dc0);
  if (!bVar1) {
    testing::Message::Message(local_df8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_dc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_48.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x15d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_48.message_,local_df8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_48.message_);
    testing::Message::~Message(local_df8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_dc0);
  local_e18._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e48,"duplicateId",&local_e49);
  libcellml::Annotator::component((string *)&local_e28);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::Component>>
            (local_e18 + 8,"nullptr",(void **)"annotator->component(\"duplicateId\")",
             (shared_ptr<libcellml::Component> *)local_e18,&local_e28);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_e28);
  std::__cxx11::string::~string(local_e48);
  std::allocator<char>::~allocator(&local_e49);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_e18 + 8));
  if (!bVar1) {
    testing::Message::Message(local_e58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_e18 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_49.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x15f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_49.message_,local_e58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_49.message_);
    testing::Message::~Message(local_e58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_e18 + 8));
  local_e80[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_e80[0] = libcellml::Logger::warningCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_e70,"size_t(1)","annotator->warningCount()",local_e80 + 1,
             local_e80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e70);
  if (!bVar1) {
    testing::Message::Message(local_e88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_50.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x160,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_50.message_,local_e88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_50.message_);
    testing::Message::~Message(local_e88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e70);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::warning((ulong)&local_ed0);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_ed0);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[94],std::__cxx11::string>
            ((EqHelper<false> *)local_ea0,
             "\"The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located.\""
             ,"annotator->warning(0)->description()",
             (char (*) [94])
             "The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located."
             ,&local_ec0);
  std::__cxx11::string::~string((string *)&local_ec0);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_ed0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ea0);
  if (!bVar1) {
    testing::Message::Message(local_ed8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ea0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_51.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x161,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_51.message_,local_ed8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_51.message_);
    testing::Message::~Message(local_ed8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ea0);
  local_ef8._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f28,"duplicateId",&local_f29);
  libcellml::Annotator::variable((string *)&local_f08);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Variable>>
            (local_ef8 + 8,"nullptr",(void **)"annotator->variable(\"duplicateId\")",
             (shared_ptr<libcellml::Variable> *)local_ef8,&local_f08);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_f08);
  std::__cxx11::string::~string(local_f28);
  std::allocator<char>::~allocator(&local_f29);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_ef8 + 8));
  if (!bVar1) {
    testing::Message::Message(local_f38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_ef8 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_52.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x163,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_52.message_,local_f38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_52.message_);
    testing::Message::~Message(local_f38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_ef8 + 8));
  local_f60[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_f60[0] = libcellml::Logger::warningCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_f50,"size_t(1)","annotator->warningCount()",local_f60 + 1,
             local_f60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f50);
  if (!bVar1) {
    testing::Message::Message(local_f68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_53.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x164,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_53.message_,local_f68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_53.message_);
    testing::Message::~Message(local_f68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f50);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::warning((ulong)&local_fb0);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_fb0);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[94],std::__cxx11::string>
            ((EqHelper<false> *)local_f80,
             "\"The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located.\""
             ,"annotator->warning(0)->description()",
             (char (*) [94])
             "The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located."
             ,&local_fa0);
  std::__cxx11::string::~string((string *)&local_fa0);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_fb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f80);
  if (!bVar1) {
    testing::Message::Message(local_fb8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_54.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x165,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_54.message_,local_fb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_54.message_);
    testing::Message::~Message(local_fb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f80);
  local_fd8._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1008,"duplicateId",&local_1009);
  libcellml::Annotator::units((string *)&local_fe8);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Units>>
            (local_fd8 + 8,"nullptr",(void **)"annotator->units(\"duplicateId\")",
             (shared_ptr<libcellml::Units> *)local_fd8,&local_fe8);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_fe8);
  std::__cxx11::string::~string(local_1008);
  std::allocator<char>::~allocator(&local_1009);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_fd8 + 8));
  if (!bVar1) {
    testing::Message::Message(local_1018);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_fd8 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_55.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x167,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_55.message_,local_1018);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_55.message_);
    testing::Message::~Message(local_1018);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_fd8 + 8));
  local_1040[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_1040[0] = libcellml::Logger::warningCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1030,"size_t(1)","annotator->warningCount()",local_1040 + 1,
             local_1040);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1030);
  if (!bVar1) {
    testing::Message::Message(local_1048);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1030);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_56.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x168,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_56.message_,local_1048);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_56.message_);
    testing::Message::~Message(local_1048);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1030);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::warning((ulong)&local_1090);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1090);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[94],std::__cxx11::string>
            ((EqHelper<false> *)local_1060,
             "\"The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located.\""
             ,"annotator->warning(0)->description()",
             (char (*) [94])
             "The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located."
             ,&local_1080);
  std::__cxx11::string::~string((string *)&local_1080);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_1090);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1060);
  if (!bVar1) {
    testing::Message::Message(local_1098);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1060);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_57.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x169,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_57.message_,local_1098);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_57.message_);
    testing::Message::~Message(local_1098);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1060);
  local_10b8._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_10e8,"duplicateId",&local_10e9);
  libcellml::Annotator::unitsItem((string *)&local_10c8);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::UnitsItem>>
            (local_10b8 + 8,"nullptr",(void **)"annotator->unitsItem(\"duplicateId\")",
             (shared_ptr<libcellml::UnitsItem> *)local_10b8,&local_10c8);
  std::shared_ptr<libcellml::UnitsItem>::~shared_ptr(&local_10c8);
  std::__cxx11::string::~string(local_10e8);
  std::allocator<char>::~allocator(&local_10e9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_10b8 + 8));
  if (!bVar1) {
    testing::Message::Message(local_10f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_10b8 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_58.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x16b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_58.message_,local_10f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_58.message_);
    testing::Message::~Message(local_10f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_10b8 + 8));
  local_1120[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_1120[0] = libcellml::Logger::warningCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1110,"size_t(1)","annotator->warningCount()",local_1120 + 1,
             local_1120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1110);
  if (!bVar1) {
    testing::Message::Message(local_1128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_59.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x16c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_59.message_,local_1128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_59.message_);
    testing::Message::~Message(local_1128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1110);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::warning((ulong)&local_1170);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1170);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[94],std::__cxx11::string>
            ((EqHelper<false> *)local_1140,
             "\"The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located.\""
             ,"annotator->warning(0)->description()",
             (char (*) [94])
             "The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located."
             ,&local_1160);
  std::__cxx11::string::~string((string *)&local_1160);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_1170);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1140);
  if (!bVar1) {
    testing::Message::Message(local_1178);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_60.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x16d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_60.message_,local_1178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_60.message_);
    testing::Message::~Message(local_1178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1140);
  local_1198._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_11c8,"duplicateId",&local_11c9);
  libcellml::Annotator::reset((string *)&local_11a8);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Reset>>
            (local_1198 + 8,"nullptr",(void **)"annotator->reset(\"duplicateId\")",
             (shared_ptr<libcellml::Reset> *)local_1198,&local_11a8);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_11a8);
  std::__cxx11::string::~string(local_11c8);
  std::allocator<char>::~allocator(&local_11c9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_1198 + 8));
  if (!bVar1) {
    testing::Message::Message(local_11d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_1198 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_61.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x16f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_61.message_,local_11d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_61.message_);
    testing::Message::~Message(local_11d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_1198 + 8));
  local_1200[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_1200[0] = libcellml::Logger::warningCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_11f0,"size_t(1)","annotator->warningCount()",local_1200 + 1,
             local_1200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11f0);
  if (!bVar1) {
    testing::Message::Message(local_1208);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_11f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_62.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x170,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_62.message_,local_1208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_62.message_);
    testing::Message::~Message(local_1208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11f0);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::warning((ulong)&local_1250);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1250);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[94],std::__cxx11::string>
            ((EqHelper<false> *)local_1220,
             "\"The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located.\""
             ,"annotator->warning(0)->description()",
             (char (*) [94])
             "The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located."
             ,&local_1240);
  std::__cxx11::string::~string((string *)&local_1240);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_1250);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1220);
  if (!bVar1) {
    testing::Message::Message(local_1258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_63.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x171,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_63.message_,local_1258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_63.message_);
    testing::Message::~Message(local_1258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1220);
  local_1278._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_12a8,"duplicateId",&local_12a9);
  libcellml::Annotator::resetValue((string *)&local_1288);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Reset>>
            (local_1278 + 8,"nullptr",(void **)"annotator->resetValue(\"duplicateId\")",
             (shared_ptr<libcellml::Reset> *)local_1278,&local_1288);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_1288);
  std::__cxx11::string::~string(local_12a8);
  std::allocator<char>::~allocator(&local_12a9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_1278 + 8));
  if (!bVar1) {
    testing::Message::Message(local_12b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_1278 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_64.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x173,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_64.message_,local_12b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_64.message_);
    testing::Message::~Message(local_12b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_1278 + 8));
  local_12e0[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_12e0[0] = libcellml::Logger::warningCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_12d0,"size_t(1)","annotator->warningCount()",local_12e0 + 1,
             local_12e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12d0);
  if (!bVar1) {
    testing::Message::Message(local_12e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_12d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_65.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x174,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_65.message_,local_12e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_65.message_);
    testing::Message::~Message(local_12e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12d0);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::warning((ulong)&local_1330);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1330);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[94],std::__cxx11::string>
            ((EqHelper<false> *)local_1300,
             "\"The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located.\""
             ,"annotator->warning(0)->description()",
             (char (*) [94])
             "The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located."
             ,&local_1320);
  std::__cxx11::string::~string((string *)&local_1320);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_1330);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1300);
  if (!bVar1) {
    testing::Message::Message(local_1338);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_66.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x175,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_66.message_,local_1338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_66.message_);
    testing::Message::~Message(local_1338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1300);
  local_1358._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1388,"duplicateId",&local_1389);
  libcellml::Annotator::testValue((string *)&local_1368);
  testing::internal::EqHelper<true>::Compare<decltype(nullptr),std::shared_ptr<libcellml::Reset>>
            (local_1358 + 8,"nullptr",(void **)"annotator->testValue(\"duplicateId\")",
             (shared_ptr<libcellml::Reset> *)local_1358,&local_1368);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_1368);
  std::__cxx11::string::~string(local_1388);
  std::allocator<char>::~allocator(&local_1389);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_1358 + 8));
  if (!bVar1) {
    testing::Message::Message(local_1398);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_1358 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_67.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x177,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_67.message_,local_1398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_67.message_);
    testing::Message::~Message(local_1398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_1358 + 8));
  local_13c0[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_13c0[0] = libcellml::Logger::warningCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_13b0,"size_t(1)","annotator->warningCount()",local_13c0 + 1,
             local_13c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13b0);
  if (!bVar1) {
    testing::Message::Message(local_13c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_13b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_68.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x178,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_68.message_,local_13c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_68.message_);
    testing::Message::~Message(local_13c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_13b0);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::warning((ulong)&local_1410);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1410);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[94],std::__cxx11::string>
            ((EqHelper<false> *)local_13e0,
             "\"The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located.\""
             ,"annotator->warning(0)->description()",
             (char (*) [94])
             "The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located."
             ,&local_1400);
  std::__cxx11::string::~string((string *)&local_1400);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_1410);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13e0);
  if (!bVar1) {
    testing::Message::Message(local_1418);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_13e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_69.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x179,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_69.message_,local_1418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_69.message_);
    testing::Message::~Message(local_1418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_13e0);
  local_1438._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1468,"duplicateId",&local_1469);
  libcellml::Annotator::componentEncapsulation((string *)&local_1448);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::Component>>
            (local_1438 + 8,"nullptr",(void **)"annotator->componentEncapsulation(\"duplicateId\")",
             (shared_ptr<libcellml::Component> *)local_1438,&local_1448);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_1448);
  std::__cxx11::string::~string(local_1468);
  std::allocator<char>::~allocator(&local_1469);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_1438 + 8));
  if (!bVar1) {
    testing::Message::Message(local_1478);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_1438 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_70.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x17b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_70.message_,local_1478);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_70.message_);
    testing::Message::~Message(local_1478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_1438 + 8));
  local_14a0[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_14a0[0] = libcellml::Logger::warningCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1490,"size_t(1)","annotator->warningCount()",local_14a0 + 1,
             local_14a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1490);
  if (!bVar1) {
    testing::Message::Message(local_14a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1490);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_71.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x17c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_71.message_,local_14a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_71.message_);
    testing::Message::~Message(local_14a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1490);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::warning((ulong)&local_14f0);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_14f0);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[94],std::__cxx11::string>
            ((EqHelper<false> *)local_14c0,
             "\"The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located.\""
             ,"annotator->warning(0)->description()",
             (char (*) [94])
             "The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located."
             ,&local_14e0);
  std::__cxx11::string::~string((string *)&local_14e0);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_14f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14c0);
  if (!bVar1) {
    testing::Message::Message(local_14f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_14c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_72.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x17d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_72.message_,local_14f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_72.message_);
    testing::Message::~Message(local_14f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_14c0);
  local_1518._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1548,"duplicateId",&local_1549);
  libcellml::Annotator::connection((string *)&local_1528);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::VariablePair>>
            (local_1518 + 8,"nullptr",(void **)"annotator->connection(\"duplicateId\")",
             (shared_ptr<libcellml::VariablePair> *)local_1518,&local_1528);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr(&local_1528);
  std::__cxx11::string::~string(local_1548);
  std::allocator<char>::~allocator(&local_1549);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_1518 + 8));
  if (!bVar1) {
    testing::Message::Message(local_1558);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_1518 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_73.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x17f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_73.message_,local_1558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_73.message_);
    testing::Message::~Message(local_1558);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_1518 + 8));
  local_1580[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_1580[0] = libcellml::Logger::warningCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1570,"size_t(1)","annotator->warningCount()",local_1580 + 1,
             local_1580);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1570);
  if (!bVar1) {
    testing::Message::Message(local_1588);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1570);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_74.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x180,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_74.message_,local_1588);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_74.message_);
    testing::Message::~Message(local_1588);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1570);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::warning((ulong)&local_15d0);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_15d0);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[94],std::__cxx11::string>
            ((EqHelper<false> *)local_15a0,
             "\"The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located.\""
             ,"annotator->warning(0)->description()",
             (char (*) [94])
             "The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located."
             ,&local_15c0);
  std::__cxx11::string::~string((string *)&local_15c0);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_15d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15a0);
  if (!bVar1) {
    testing::Message::Message(local_15d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_15a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_75.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x181,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_75.message_,local_15d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_75.message_);
    testing::Message::~Message(local_15d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_15a0);
  local_15f8._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1628,"duplicateId",&local_1629);
  libcellml::Annotator::mapVariables((string *)&local_1608);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::VariablePair>>
            (local_15f8 + 8,"nullptr",(void **)"annotator->mapVariables(\"duplicateId\")",
             (shared_ptr<libcellml::VariablePair> *)local_15f8,&local_1608);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr(&local_1608);
  std::__cxx11::string::~string(local_1628);
  std::allocator<char>::~allocator(&local_1629);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_15f8 + 8));
  if (!bVar1) {
    testing::Message::Message(local_1638);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_15f8 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_76.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x183,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_76.message_,local_1638);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_76.message_);
    testing::Message::~Message(local_1638);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_15f8 + 8));
  local_1660[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_1660[0] = libcellml::Logger::warningCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1650,"size_t(1)","annotator->warningCount()",local_1660 + 1,
             local_1660);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1650);
  if (!bVar1) {
    testing::Message::Message(local_1668);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1650);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_77.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x184,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_77.message_,local_1668);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_77.message_);
    testing::Message::~Message(local_1668);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1650);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::warning((ulong)&local_16b0);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_16b0);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[94],std::__cxx11::string>
            ((EqHelper<false> *)local_1680,
             "\"The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located.\""
             ,"annotator->warning(0)->description()",
             (char (*) [94])
             "The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located."
             ,&local_16a0);
  std::__cxx11::string::~string((string *)&local_16a0);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_16b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1680);
  if (!bVar1) {
    testing::Message::Message(local_16b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1680);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_78.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x185,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_78.message_,local_16b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_78.message_);
    testing::Message::~Message(local_16b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1680);
  local_16d8._0_8_ = (element_type *)0x0;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1708,"duplicateId",&local_1709);
  libcellml::Annotator::importSource((string *)&local_16e8);
  testing::internal::EqHelper<true>::
  Compare<decltype(nullptr),std::shared_ptr<libcellml::ImportSource>>
            (local_16d8 + 8,"nullptr",(void **)"annotator->importSource(\"duplicateId\")",
             (shared_ptr<libcellml::ImportSource> *)local_16d8,&local_16e8);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr(&local_16e8);
  std::__cxx11::string::~string(local_1708);
  std::allocator<char>::~allocator(&local_1709);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_16d8 + 8));
  if (!bVar1) {
    testing::Message::Message(local_1718);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_16d8 + 8));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_79.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x187,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_79.message_,local_1718);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_79.message_);
    testing::Message::~Message(local_1718);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_16d8 + 8));
  local_1740[1] = 1;
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_1740[0] = libcellml::Logger::warningCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1730,"size_t(1)","annotator->warningCount()",local_1740 + 1,
             local_1740);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1730);
  if (!bVar1) {
    testing::Message::Message(local_1748);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1730);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_80.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x188,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_80.message_,local_1748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_80.message_);
    testing::Message::~Message(local_1748);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1730);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::warning((ulong)&local_1790);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1790);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[94],std::__cxx11::string>
            ((EqHelper<false> *)local_1760,
             "\"The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located.\""
             ,"annotator->warning(0)->description()",
             (char (*) [94])
             "The identifier \'duplicateId\' occurs 29 times in the model so a unique item cannot be located."
             ,&local_1780);
  std::__cxx11::string::~string((string *)&local_1780);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_1790);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1760);
  if (!bVar1) {
    testing::Message::Message(local_1798);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1760);
    testing::internal::AssertHelper::AssertHelper
              (local_17a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x189,pcVar2);
    testing::internal::AssertHelper::operator=(local_17a0,local_1798);
    testing::internal::AssertHelper::~AssertHelper(local_17a0);
    testing::Message::~Message(local_1798);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1760);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_40);
  std::shared_ptr<libcellml::Annotator>::~shared_ptr
            ((shared_ptr<libcellml::Annotator> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(Annotator, getItemBySpecificTypeDuplicateId)
{
    auto parser = libcellml::Parser::create();
    auto annotator = libcellml::Annotator::create();
    auto model = parser->parseModel(modelStringDuplicateIds);

    EXPECT_EQ(nullptr, annotator->model("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    EXPECT_EQ(nullptr, annotator->encapsulation("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    EXPECT_EQ(nullptr, annotator->component("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    EXPECT_EQ(nullptr, annotator->variable("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    EXPECT_EQ(nullptr, annotator->units("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    EXPECT_EQ(nullptr, annotator->unitsItem("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    EXPECT_EQ(nullptr, annotator->reset("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    EXPECT_EQ(nullptr, annotator->resetValue("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    EXPECT_EQ(nullptr, annotator->testValue("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    EXPECT_EQ(nullptr, annotator->componentEncapsulation("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    EXPECT_EQ(nullptr, annotator->connection("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    EXPECT_EQ(nullptr, annotator->mapVariables("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    EXPECT_EQ(nullptr, annotator->importSource("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    annotator->setModel(model);

    // Expect that the errors have been cleared.
    EXPECT_EQ(size_t(0), annotator->errorCount());
    EXPECT_EQ(size_t(0), annotator->warningCount());
    EXPECT_EQ(size_t(0), annotator->messageCount());

    // Cannot find unique id so no item is available.
    EXPECT_EQ(nullptr, annotator->model("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());

    EXPECT_EQ(nullptr, annotator->encapsulation("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());

    EXPECT_EQ(nullptr, annotator->component("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());

    EXPECT_EQ(nullptr, annotator->variable("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());

    EXPECT_EQ(nullptr, annotator->units("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());

    EXPECT_EQ(nullptr, annotator->unitsItem("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());

    EXPECT_EQ(nullptr, annotator->reset("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());

    EXPECT_EQ(nullptr, annotator->resetValue("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());

    EXPECT_EQ(nullptr, annotator->testValue("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());

    EXPECT_EQ(nullptr, annotator->componentEncapsulation("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());

    EXPECT_EQ(nullptr, annotator->connection("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());

    EXPECT_EQ(nullptr, annotator->mapVariables("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());

    EXPECT_EQ(nullptr, annotator->importSource("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());
}